

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizeImage.cpp
# Opt level: O0

void resizeLatLong(EnvmapImage *image1,EnvmapImage *image2,Box2i *image2DataWindow,
                  float filterRadius,int numSamples)

{
  Vec2 *pVVar1;
  Rgba RVar2;
  Rgba *pRVar3;
  Vec2 *in_RDX;
  EnvmapImage *in_RSI;
  float in_XMM0_Da;
  V3f dir;
  int x;
  int y;
  Array2D<Imf_3_2::Rgba> *pixels;
  float radius;
  int h;
  int w;
  int in_stack_000000b8;
  float in_stack_000000bc;
  V3f *in_stack_000000c0;
  EnvmapImage *in_stack_000000c8;
  Box2i *in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar4;
  undefined4 uStack_58;
  Vec2<float> local_54;
  Vec3<float> local_4c;
  int local_40;
  int local_3c;
  Array2D<Imf_3_2::Rgba> *local_38;
  float local_2c;
  int local_28;
  int local_24;
  Vec2 *local_18;
  EnvmapImage *local_10;
  
  local_24 = (*(int *)(in_RDX + 8) - *(int *)in_RDX) + 1;
  local_28 = (*(int *)(in_RDX + 0xc) - *(int *)(in_RDX + 4)) + 1;
  local_2c = (in_XMM0_Da * 3.1415927) / (float)local_24;
  local_18 = in_RDX;
  local_10 = in_RSI;
  EnvmapImage::resize((EnvmapImage *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (Envmap)in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
  EnvmapImage::clear((EnvmapImage *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_38 = EnvmapImage::pixels(local_10);
  for (local_3c = 0; local_3c < local_28; local_3c = local_3c + 1) {
    for (local_40 = 0; pVVar1 = local_18, local_40 < local_24; local_40 = local_40 + 1) {
      Imath_3_2::Vec2<float>::Vec2(&local_54,(float)local_40,(float)local_3c);
      Imf_3_2::LatLongMap::direction((Box *)&local_4c,pVVar1);
      Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)&stack0xffffffffffffff98,&local_4c);
      RVar2 = EnvmapImage::filteredLookup
                        (in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,in_stack_000000b8);
      uVar4 = RVar2._0_4_;
      uStack_58 = RVar2._4_4_;
      pRVar3 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_38,(long)local_3c);
      RVar2.b._h = (undefined2)uStack_58;
      RVar2.a._h = uStack_58._2_2_;
      RVar2.r._h = (short)uVar4;
      RVar2.g._h = (short)((uint)uVar4 >> 0x10);
      pRVar3[local_40] = RVar2;
    }
  }
  return;
}

Assistant:

void
resizeLatLong (
    const EnvmapImage& image1,
    EnvmapImage&       image2,
    const Box2i&       image2DataWindow,
    float              filterRadius,
    int                numSamples)
{
    int   w      = image2DataWindow.max.x - image2DataWindow.min.x + 1;
    int   h      = image2DataWindow.max.y - image2DataWindow.min.y + 1;
    float radius = 0.5f * 2 * M_PI * filterRadius / w;

    image2.resize (ENVMAP_LATLONG, image2DataWindow);
    image2.clear ();

    Array2D<Rgba>& pixels = image2.pixels ();

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            V3f dir      = LatLongMap::direction (image2DataWindow, V2f (x, y));
            pixels[y][x] = image1.filteredLookup (dir, radius, numSamples);
        }
    }
}